

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha224.c
# Opt level: O0

int SHA256FinalBits(SHA256Context *context,uint8_t message_bits,uint length)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  byte local_30 [8];
  uint8_t markbit [8];
  uint8_t masks [8];
  uint32_t addTemp;
  int result;
  uint length_local;
  uint8_t message_bits_local;
  SHA256Context *context_local;
  
  markbit[0] = '\0';
  markbit[1] = 0x80;
  markbit[2] = 0xc0;
  markbit[3] = 0xe0;
  markbit[4] = 0xf0;
  markbit[5] = 0xf8;
  markbit[6] = 0xfc;
  markbit[7] = 0xfe;
  local_30[0] = 0x80;
  local_30[1] = 0x40;
  local_30[2] = 0x20;
  local_30[3] = 0x10;
  local_30[4] = 8;
  local_30[5] = 4;
  local_30[6] = 2;
  local_30[7] = 1;
  if (length == 0) {
    masks[4] = '\0';
    masks[5] = '\0';
    masks[6] = '\0';
    masks[7] = '\0';
  }
  else if (context == (SHA256Context *)0x0) {
    masks[4] = '\x01';
    masks[5] = '\0';
    masks[6] = '\0';
    masks[7] = '\0';
  }
  else if (((context->Computed == 0) && (length < 8)) && (length != 0)) {
    if (context->Corrupted == 0) {
      uVar1 = context->Length_Low;
      uVar4 = length + context->Length_Low;
      context->Length_Low = uVar4;
      bVar5 = false;
      if (uVar4 < uVar1) {
        uVar2 = context->Length_High + 1;
        context->Length_High = uVar2;
        bVar5 = uVar2 == 0;
      }
      context->Corrupted = (uint)bVar5;
      SHA224_256Finalize(context,message_bits & markbit[length] | markbit[(ulong)length - 8]);
      masks[4] = '\0';
      masks[5] = '\0';
      masks[6] = '\0';
      masks[7] = '\0';
    }
    else {
      masks._4_4_ = context->Corrupted;
    }
  }
  else {
    context->Corrupted = 3;
    masks[4] = '\x03';
    masks[5] = '\0';
    masks[6] = '\0';
    masks[7] = '\0';
  }
  iVar3._0_1_ = masks[4];
  iVar3._1_1_ = masks[5];
  iVar3._2_1_ = masks[6];
  iVar3._3_1_ = masks[7];
  return iVar3;
}

Assistant:

int SHA256FinalBits(SHA256Context *context, const uint8_t message_bits, unsigned int length)
{
    int result;
    uint32_t addTemp;
    uint8_t masks[8] = {
        /* 0 0b00000000 */ 0x00, /* 1 0b10000000 */ 0x80,
        /* 2 0b11000000 */ 0xC0, /* 3 0b11100000 */ 0xE0,
        /* 4 0b11110000 */ 0xF0, /* 5 0b11111000 */ 0xF8,
        /* 6 0b11111100 */ 0xFC, /* 7 0b11111110 */ 0xFE
    };

    uint8_t markbit[8] = {
        /* 0 0b10000000 */ 0x80, /* 1 0b01000000 */ 0x40,
        /* 2 0b00100000 */ 0x20, /* 3 0b00010000 */ 0x10,
        /* 4 0b00001000 */ 0x08, /* 5 0b00000100 */ 0x04,
        /* 6 0b00000010 */ 0x02, /* 7 0b00000001 */ 0x01
    };

    if (!length)
    {
        result = shaSuccess;
    }
    else if (!context)
    {
        result = shaNull;
    }
    else if ((context->Computed) || (length >= 8) || (length == 0))
    {
        result = context->Corrupted = shaStateError;
    }
    else if (context->Corrupted)
    {
        result = context->Corrupted;
    }
    else
    {
        SHA224_256AddLength(context, length);
        SHA224_256Finalize(context, (uint8_t)((message_bits & masks[length]) | markbit[length]));
        result = shaSuccess;
    }
    return result;
}